

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

StatusOr<absl::lts_20240722::Span<char>_> * __thiscall
google::protobuf::json_internal::anon_unknown_5::DecodeBase64InPlace
          (StatusOr<absl::lts_20240722::Span<char>_> *__return_storage_ptr__,anon_unknown_5 *this,
          Span<char> base64)

{
  long lVar1;
  long lVar2;
  anon_unknown_5 *paVar3;
  uint uVar4;
  pointer pcVar5;
  anon_unknown_5 *paVar6;
  long lStack_40;
  Status SStack_38;
  
  paVar6 = this + (long)base64.ptr_;
  lVar2 = 2;
  lVar1 = 0;
  for (pcVar5 = (pointer)0x0; this + (long)pcVar5 < this + ((uint)base64.ptr_ & 0xfffffffc);
      pcVar5 = pcVar5 + 4) {
    uVar4 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)(this + 3)[(long)pcVar5]] |
            (int)(char)(anonymous_namespace)::kBase64Table[(byte)(this + 2)[(long)pcVar5]] << 6 |
            (int)(char)(anonymous_namespace)::kBase64Table[(byte)(this + 1)[(long)pcVar5]] << 0xc |
            (int)(char)(anonymous_namespace)::kBase64Table[(byte)this[(long)pcVar5]] << 0x12;
    if ((int)uVar4 < 0) {
      if ((this + 3)[(long)pcVar5] == (anon_unknown_5)0x3d && base64.ptr_ + -4 == pcVar5) {
        if ((this + 2)[(long)pcVar5] == (anon_unknown_5)0x3d) {
          paVar6 = paVar6 + -2;
        }
        else {
          paVar6 = paVar6 + -1;
        }
      }
      break;
    }
    this[lVar2 + -2] = SUB41(uVar4 >> 0x10,0);
    this[lVar2 + -1] = SUB41(uVar4 >> 8,0);
    this[lVar2] = SUB41(uVar4,0);
    lVar1 = lVar1 + -3;
    lVar2 = lVar2 + 3;
  }
  paVar3 = this;
  if (this + (long)pcVar5 < paVar6) {
    if (paVar6 + (-(long)pcVar5 - (long)this) == (anon_unknown_5 *)0x3) {
      uVar4 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)(this + 2)[(long)pcVar5]] << 6 |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)(this + 1)[(long)pcVar5]] << 0xc
              | (int)(char)(anonymous_namespace)::kBase64Table[(byte)this[(long)pcVar5]] << 0x12;
      this[lVar2 + -2] = SUB41(uVar4 >> 0x10,0);
      this[lVar2 + -1] = SUB41(uVar4 >> 8,0);
      lStack_40 = 2;
LAB_0029414b:
      if (-1 < (int)uVar4) {
        paVar3 = this + lStack_40;
        goto LAB_00294153;
      }
    }
    else if (paVar6 + (-(long)pcVar5 - (long)this) == (anon_unknown_5 *)0x2) {
      uVar4 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)(this + 1)[(long)pcVar5]] << 0xc
              | (int)(char)(anonymous_namespace)::kBase64Table[(byte)this[(long)pcVar5]] << 0x12;
      this[lVar2 + -2] = SUB41(uVar4 >> 0x10,0);
      lStack_40 = 1;
      goto LAB_0029414b;
    }
    absl::lts_20240722::InvalidArgumentError(&SStack_38,0xe,"corrupt base64");
    absl::lts_20240722::internal_statusor::StatusOrData<absl::lts_20240722::Span<char>_>::
    StatusOrData<absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>,
               &SStack_38);
    absl::lts_20240722::Status::~Status(&SStack_38);
  }
  else {
LAB_00294153:
    (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_1.data_.ptr_
         = (pointer)this;
    (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_1.data_.len_
         = (size_type)(paVar3 + (-(long)this - lVar1));
    (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_0 =
         (anon_union_8_1_1246618d_for_StatusOrData<absl::lts_20240722::Span<char>_>_1)0x1;
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<absl::Span<char>> DecodeBase64InPlace(absl::Span<char> base64) {
  // We decode in place. This is safe because this is a new buffer (not
  // aliasing the input) and because base64 decoding shrinks 4 bytes into 3.
  char* out = base64.data();
  const char* ptr = base64.data();
  const char* end = ptr + base64.size();
  const char* end4 = ptr + (base64.size() & ~3u);

  for (; ptr < end4; ptr += 4, out += 3) {
    auto val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
               Base64Lookup(ptr[2]) << 6 | Base64Lookup(ptr[3]) << 0;

    if (static_cast<int32_t>(val) < 0) {
      // Junk chars or padding. Remove trailing padding, if any.
      if (end - ptr == 4 && ptr[3] == '=') {
        if (ptr[2] == '=') {
          end -= 2;
        } else {
          end -= 1;
        }
      }
      break;
    }

    out[0] = val >> 16;
    out[1] = (val >> 8) & 0xff;
    out[2] = val & 0xff;
  }

  if (ptr < end) {
    uint32_t val = ~0u;
    switch (end - ptr) {
      case 2:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12;
        out[0] = val >> 16;
        out += 1;
        break;
      case 3:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
              Base64Lookup(ptr[2]) << 6;
        out[0] = val >> 16;
        out[1] = (val >> 8) & 0xff;
        out += 2;
        break;
    }

    if (static_cast<int32_t>(val) < 0) {
      return absl::InvalidArgumentError("corrupt base64");
    }
  }

  return absl::Span<char>(base64.data(),
                          static_cast<size_t>(out - base64.data()));
}